

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O2

Status __thiscall
leveldb::anon_unknown_2::InMemoryEnv::GetChildren
          (InMemoryEnv *this,string *dir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RCX;
  Slice local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::mutex::lock((mutex *)&dir->field_2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_RCX);
  for (p_Var4 = (_Rb_tree_node_base *)dir[2].field_2._M_allocated_capacity;
      p_Var4 != (_Rb_tree_node_base *)(dir + 2);
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    pbVar1 = (result->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((_Base_ptr)((long)&(pbVar1->_M_dataplus)._M_p + 1U) <= p_Var4[1]._M_parent) {
      pcVar2 = *(pointer *)(p_Var4 + 1);
      if (pcVar2[(long)pbVar1] == '/') {
        local_60.data_ =
             (char *)(result->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
        local_60.size_ = (size_t)pbVar1;
        local_50._M_dataplus._M_p = pcVar2;
        local_50._M_string_length = (size_type)p_Var4[1]._M_parent;
        bVar3 = Slice::starts_with((Slice *)&local_50,&local_60);
        if (bVar3) {
          std::__cxx11::string::substr((ulong)&local_50,(ulong)(p_Var4 + 1));
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(in_RCX,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
    }
  }
  (this->super_EnvWrapper).super_Env._vptr_Env = (_func_int **)0x0;
  pthread_mutex_unlock((pthread_mutex_t *)&dir->field_2);
  return (Status)(char *)this;
}

Assistant:

Status GetChildren(const std::string& dir,
                     std::vector<std::string>* result) override {
    MutexLock lock(&mutex_);
    result->clear();

    for (const auto& kvp : file_map_) {
      const std::string& filename = kvp.first;

      if (filename.size() >= dir.size() + 1 && filename[dir.size()] == '/' &&
          Slice(filename).starts_with(Slice(dir))) {
        result->push_back(filename.substr(dir.size() + 1));
      }
    }

    return Status::OK();
  }